

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

sunindextype SUNDlsMat_densePOTRF(sunrealtype **a,sunindextype m)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  sunrealtype sVar7;
  double dVar8;
  
  lVar6 = 0;
  if (0 < m) {
    lVar6 = m;
  }
  lVar5 = 0;
  while( true ) {
    lVar4 = lVar5;
    if (lVar5 < m) {
      lVar4 = m;
    }
    if (lVar5 == lVar6) {
      return 0;
    }
    psVar1 = a[lVar5];
    lVar2 = lVar5;
    if (lVar5 != 0) {
      for (; lVar2 != m; lVar2 = lVar2 + 1) {
        sVar7 = psVar1[lVar2];
        for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
          sVar7 = sVar7 - a[lVar3][lVar2] * a[lVar3][lVar5];
          psVar1[lVar2] = sVar7;
        }
      }
    }
    dVar8 = psVar1[lVar5];
    if (dVar8 <= 0.0) break;
    lVar2 = lVar5;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    for (; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      psVar1[lVar2] = psVar1[lVar2] / dVar8;
    }
    lVar5 = lVar5 + 1;
  }
  return lVar5 + 1;
}

Assistant:

sunindextype SUNDlsMat_densePOTRF(sunrealtype** a, sunindextype m)
{
  sunrealtype *a_col_j, *a_col_k;
  sunrealtype a_diag;
  sunindextype i, j, k;

  for (j = 0; j < m; j++)
  {
    a_col_j = a[j];

    if (j > 0)
    {
      for (i = j; i < m; i++)
      {
        for (k = 0; k < j; k++)
        {
          a_col_k = a[k];
          a_col_j[i] -= a_col_k[i] * a_col_k[j];
        }
      }
    }

    a_diag = a_col_j[j];
    if (a_diag <= ZERO) { return (j + 1); }
    a_diag = SUNRsqrt(a_diag);

    for (i = j; i < m; i++) { a_col_j[i] /= a_diag; }
  }

  return (0);
}